

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archive.cpp
# Opt level: O0

void __thiscall celero::Archive::Impl::readExistingResults(Impl *this)

{
  byte bVar1;
  long lVar2;
  streamoff sVar3;
  bool bVar4;
  undefined1 local_398 [8];
  ArchiveEntry r;
  string local_218 [8];
  ifstream is;
  Impl *this_local;
  
  std::ifstream::ifstream(local_218);
  std::ifstream::open(local_218,(int)this + (_S_out|_S_in));
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 1) {
    bVar1 = std::ios::good();
    if ((bVar1 & 1) == 1) {
      bVar1 = std::ios::fail();
      if ((bVar1 & 1) == 0) {
        lVar2 = std::numeric_limits<long>::max();
        std::istream::ignore((long)local_218,(int)lVar2);
        while( true ) {
          bVar1 = std::ios::eof();
          bVar4 = false;
          if ((bVar1 & 1) == 0) {
            r._344_8_ = std::istream::tellg();
            sVar3 = std::fpos::operator_cast_to_long((fpos *)&r.Failure);
            bVar4 = -1 < sVar3;
          }
          if (!bVar4) break;
          ArchiveEntry::ArchiveEntry((ArchiveEntry *)local_398);
          operator>>((istream *)local_218,(ArchiveEntry *)local_398);
          bVar1 = std::__cxx11::string::empty();
          if ((bVar1 & 1) == 0) {
            std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>::push_back
                      (&this->results,(value_type *)local_398);
          }
          ArchiveEntry::~ArchiveEntry((ArchiveEntry *)local_398);
        }
        std::ifstream::close();
      }
    }
  }
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void readExistingResults()
	{
		// Read in existing results?
		std::ifstream is;
		is.open(this->fileName, std::fstream::in);

		if((is.is_open() == true) && (is.good() == true) && (is.fail() == false))
		{
			// Throw away the header.
			is.ignore(std::numeric_limits<std::streamsize>::max(), '\n');

			// Read in existing results.
			while((is.eof() == false) && (is.tellg() >= 0))
			{
				ArchiveEntry r;
				is >> r;

				if(r.GroupName.empty() == false)
				{
					this->results.push_back(r);
				}
			}

			// Close the file for reading.
			is.close();
		}
	}